

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::FBmTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,FBmTexture *this)

{
  int *in_R9;
  
  StringPrintf<pbrt::TextureMapping3DHandle_const&,float_const&,int_const&>
            (__return_storage_ptr__,(pbrt *)"[ FBmTexture mapping: %s omega: %f octaves: %d ]",
             (char *)this,(TextureMapping3DHandle *)&this->omega,(float *)&this->octaves,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string FBmTexture::ToString() const {
    return StringPrintf("[ FBmTexture mapping: %s omega: %f octaves: %d ]", mapping,
                        omega, octaves);
}